

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O3

long uv__idna_toascii(char *s,char *se,char *d,char *de)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  char *si;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_48 = d;
  local_40 = d;
  local_38 = s;
LAB_00163d6a:
  while (pcVar3 = local_38, local_38 < se) {
    uVar1 = uv__utf8_decode1(&local_38,se);
    if ((int)uVar1 < 0x3002) goto LAB_00163d9d;
    if (((uVar1 == 0x3002) || (uVar1 == 0xff61)) || (uVar1 == 0xff0e)) goto LAB_00163da7;
  }
  if ((s < se) && (iVar2 = uv__idna_toascii_label(s,se,&local_48,de), d = local_48, iVar2 < 0)) {
LAB_00163e21:
    lVar4 = (long)iVar2;
  }
  else {
    pcVar3 = d;
    if (d < de) {
      pcVar3 = d + 1;
      *d = '\0';
    }
    lVar4 = (long)pcVar3 - (long)local_40;
  }
  return lVar4;
LAB_00163d9d:
  if (uVar1 == 0xffffffff) {
    return -0x16;
  }
  if (uVar1 == 0x2e) {
LAB_00163da7:
    iVar2 = uv__idna_toascii_label(s,pcVar3,&local_48,de);
    if (iVar2 < 0) goto LAB_00163e21;
    s = local_38;
    d = local_48;
    if (local_48 < de) {
      d = local_48 + 1;
      *local_48 = '.';
      local_48 = d;
    }
  }
  goto LAB_00163d6a;
}

Assistant:

long uv__idna_toascii(const char* s, const char* se, char* d, char* de) {
  const char* si;
  const char* st;
  unsigned c;
  char* ds;
  int rc;

  ds = d;

  si = s;
  while (si < se) {
    st = si;
    c = uv__utf8_decode1(&si, se);

    if (c == -1u)
      return UV_EINVAL;

    if (c != '.')
      if (c != 0x3002)  /* 。 */
        if (c != 0xFF0E)  /* ． */
          if (c != 0xFF61)  /* ｡ */
            continue;

    rc = uv__idna_toascii_label(s, st, &d, de);

    if (rc < 0)
      return rc;

    if (d < de)
      *d++ = '.';

    s = si;
  }

  if (s < se) {
    rc = uv__idna_toascii_label(s, se, &d, de);

    if (rc < 0)
      return rc;
  }

  if (d < de)
    *d++ = '\0';

  return d - ds;  /* Number of bytes written. */
}